

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O2

void __thiscall
Assimp::STLExporter::STLExporter
          (STLExporter *this,char *_filename,aiScene *pScene,bool exportPointClouds,bool binary)

{
  string *this_00;
  ostream *poVar1;
  DeadlyImportError *this_01;
  ulong uVar2;
  uint uVar3;
  uint i_1;
  allocator local_c1;
  locale local_c0 [8];
  locale local_b8 [12];
  int local_ac;
  string local_a8;
  string name;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::string::string((string *)&this->filename,_filename,(allocator *)&name);
  this_00 = &this->endl;
  std::__cxx11::string::string((string *)this_00,"\n",(allocator *)&name);
  std::locale::locale(local_c0,"C");
  std::ios::imbue(local_b8);
  std::locale::~locale(local_b8);
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  if (binary) {
    name.field_2._M_allocated_capacity = 0;
    name.field_2._8_8_ = 0;
    name._M_dataplus._M_p = (pointer)0x6353706d69737341;
    name._M_string_length = 0x656e65;
    std::ostream::write((char *)this,(long)&name);
    local_ac = 0;
    for (uVar2 = 0; uVar2 != pScene->mNumMeshes; uVar2 = uVar2 + 1) {
      for (uVar3 = 0; uVar3 < pScene->mMeshes[uVar2]->mNumFaces; uVar3 = uVar3 + 1) {
      }
      local_ac = local_ac + uVar3;
    }
    std::ostream::write((char *)this,(long)&local_ac);
    if (exportPointClouds) {
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_a8,"This functionality is not yet implemented for binary output.",
                 &local_c1);
      DeadlyImportError::DeadlyImportError(this_01,&local_a8);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    for (uVar2 = 0; uVar2 < pScene->mNumMeshes; uVar2 = uVar2 + 1) {
      WriteMeshBinary(this,pScene->mMeshes[uVar2]);
    }
  }
  else {
    if (exportPointClouds) {
      std::__cxx11::string::string((string *)&name,"Assimp_Pointcloud",(allocator *)&local_a8);
      WritePointCloud(this,&name,pScene);
    }
    else {
      std::__cxx11::string::string((string *)&name,"AssimpScene",(allocator *)&local_a8);
      poVar1 = std::operator<<((ostream *)this,"solid");
      poVar1 = std::operator<<(poVar1," ");
      poVar1 = std::operator<<(poVar1,(string *)&name);
      std::operator<<(poVar1,(string *)this_00);
      for (uVar2 = 0; uVar2 < pScene->mNumMeshes; uVar2 = uVar2 + 1) {
        WriteMesh(this,pScene->mMeshes[uVar2]);
      }
      poVar1 = std::operator<<((ostream *)this,"endsolid");
      poVar1 = std::operator<<(poVar1,(string *)&name);
      std::operator<<(poVar1,(string *)this_00);
    }
    std::__cxx11::string::~string((string *)&name);
  }
  std::locale::~locale(local_c0);
  return;
}

Assistant:

STLExporter::STLExporter(const char* _filename, const aiScene* pScene, bool exportPointClouds, bool binary)
: filename(_filename)
, endl("\n")
{
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    const std::locale& l = std::locale("C");
    mOutput.imbue(l);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);
    if (binary) {
        char buf[80] = {0} ;
        buf[0] = 'A'; buf[1] = 's'; buf[2] = 's'; buf[3] = 'i'; buf[4] = 'm'; buf[5] = 'p';
        buf[6] = 'S'; buf[7] = 'c'; buf[8] = 'e'; buf[9] = 'n'; buf[10] = 'e';
        mOutput.write(buf, 80);
        unsigned int meshnum = 0;
        for(unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            for (unsigned int j = 0; j < pScene->mMeshes[i]->mNumFaces; ++j) {
                meshnum++;
            }
        }
        AI_SWAP4(meshnum);
        mOutput.write((char *)&meshnum, 4);

        if (exportPointClouds) {
            throw DeadlyExportError("This functionality is not yet implemented for binary output.");
        }

        for(unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            WriteMeshBinary(pScene->mMeshes[i]);
        }
    } else {

        // Exporting only point clouds
        if (exportPointClouds) {
            WritePointCloud("Assimp_Pointcloud", pScene );
            return;
        } 

        // Export the assimp mesh 
        const std::string name = "AssimpScene";
        mOutput << SolidToken << " " << name << endl;
        for(unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            WriteMesh(pScene->mMeshes[ i ]);
        }
        mOutput << EndSolidToken << name << endl;
    }
}